

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O2

bool google::protobuf::internal::
     HandleEnum<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandlerLite,(google::protobuf::internal::Cardinality)0>
               (ParseTable *table,CodedInputStream *input,MessageLite *msg,uint32 *presence,
               uint32 presence_index,int64 offset,uint32 tag,int field_number)

{
  EnumValidator p_Var1;
  bool bVar2;
  bool bVar3;
  uint32 local_38;
  uint32 local_34;
  uint32 temp;
  
  local_34 = presence_index;
  bVar2 = io::CodedInputStream::ReadVarint32(input,&local_38);
  if (bVar2) {
    p_Var1 = table->aux[field_number].enums.validator;
    if ((p_Var1 != (EnumValidator)0x0) && (bVar3 = (*p_Var1)(local_38), !bVar3)) {
      anon_unknown_15::UnknownFieldHandlerLite::Varint(msg,table,tag,local_38);
      return bVar2;
    }
    SetBit(presence,local_34);
    *(uint32 *)((long)&msg->_vptr_MessageLite + offset) = local_38;
  }
  return bVar2;
}

Assistant:

inline bool HandleEnum(const ParseTable& table, io::CodedInputStream* input,
                       MessageLite* msg, uint32* presence,
                       uint32 presence_index, int64 offset, uint32 tag,
                       int field_number) {
  int value;
  if (PROTOBUF_PREDICT_FALSE(
          (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
              input, &value)))) {
    return false;
  }

  AuxillaryParseTableField::EnumValidator validator =
      table.aux[field_number].enums.validator;
  if (validator == nullptr || validator(value)) {
    switch (cardinality) {
      case Cardinality_SINGULAR:
        SetField(msg, presence, presence_index, offset, value);
        break;
      case Cardinality_REPEATED:
        AddField(msg, offset, value);
        break;
      case Cardinality_ONEOF:
        ClearOneofField(table.fields[presence[presence_index]], msg->GetArena(),
                        msg);
        SetOneofField(msg, presence, presence_index, offset, field_number,
                      value);
        break;
      default:
        PROTOBUF_ASSUME(false);
    }
  } else {
    UnknownFieldHandler::Varint(msg, table, tag, value);
  }

  return true;
}